

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2c0f7::ParseDummyCommand::configureOutputs
          (ParseDummyCommand *this,ConfigureContext *param_1,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
          *outputs)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  undefined8 uVar5;
  StringRef local_78;
  string local_68;
  reference local_48;
  Node **node;
  const_iterator __end3;
  const_iterator __begin3;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *__range3;
  bool first;
  vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *outputs_local
  ;
  ConfigureContext *param_1_local;
  ParseDummyCommand *this_local;
  
  uVar3 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((uVar3 & 1) != 0) {
    bVar1 = true;
    printf("  -- \'outputs\': [");
    __end3 = std::
             vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>::
             begin(outputs);
    node = (Node **)std::
                    vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                    ::end(outputs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
                                       *)&node), bVar2) {
      local_48 = __gnu_cxx::
                 __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
                 ::operator*(&__end3);
      pcVar4 = ", ";
      if (bVar1) {
        pcVar4 = "";
      }
      local_78 = llbuild::buildsystem::Node::getName(*local_48);
      llvm::StringRef::str_abi_cxx11_(&local_68,&local_78);
      uVar5 = std::__cxx11::string::c_str();
      printf("%s\'%s\'",pcVar4,uVar5);
      std::__cxx11::string::~string((string *)&local_68);
      bVar1 = false;
      __gnu_cxx::
      __normal_iterator<llbuild::buildsystem::Node_*const_*,_std::vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>_>
      ::operator++(&__end3);
    }
    printf("]\n");
  }
  return;
}

Assistant:

virtual void configureOutputs(const ConfigureContext&,
                                const std::vector<Node*>& outputs) override {
    if (delegate.shouldShowOutput()) {
      bool first = true;
      printf("  -- 'outputs': [");
      for (const auto& node: outputs) {
        printf("%s'%s'", first ? "" : ", ", node->getName().str().c_str());
        first = false;
      }
      printf("]\n");
    }
  }